

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimeSetDefaultArrival(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  Abc_ManTime_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int i;
  
  pAVar1 = pNtk->pManTime;
  if (pAVar1 == (Abc_ManTime_t *)0x0) {
    pAVar1 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar1;
  }
  (pAVar1->tArrDef).Rise = Rise;
  (pAVar1->tArrDef).Fall = Fall;
  for (i = 0; i < pNtk->vCis->nSize; i = i + 1) {
    pAVar2 = Abc_NtkCi(pNtk,i);
    Abc_NtkTimeSetArrival(pNtk,pAVar2->Id,Rise,Fall);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultArrival( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
    Abc_Obj_t * pObj; int i;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tArrDef.Rise  = Rise;
    pNtk->pManTime->tArrDef.Fall  = Fall;
    // set the arrival times for each input
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), Rise, Fall );    
}